

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void __thiscall cubeb_init_destroy_context_Test::TestBody(cubeb_init_destroy_context_Test *this)

{
  int line;
  char *pcVar1;
  anon_enum_32 *in_RCX;
  String *this_00;
  AssertionResult gtest_ar;
  cubeb *ctx;
  String local_48;
  undefined1 local_38 [12];
  int r;
  AssertHelper local_28;
  
  r = common_init(&ctx,"test_sanity");
  local_48.c_str_ = (char *)((ulong)local_48.c_str_._4_4_ << 0x20);
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&local_48,in_RCX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x54;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_48.c_str_ = (char *)0x0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,&local_48.c_str_);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pcVar1 = cubeb_get_backend_id(ctx);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar.success_ = pcVar1 != (char *)0x0;
      if (gtest_ar.success_) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        fprintf(_stderr,"Backend: %s\n",pcVar1);
        cubeb_destroy(ctx);
        return;
      }
      this_00 = (String *)local_38;
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_48,&gtest_ar,"backend_id","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,0x58,local_48.c_str_);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      testing::internal::String::~String(&local_48);
      goto LAB_001085f1;
    }
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x55;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,line,pcVar1);
  this_00 = &local_48;
  testing::internal::AssertHelper::operator=((AssertHelper *)local_38,(Message *)this_00);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
LAB_001085f1:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const* backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}